

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

ostream * pstd::operator<<(ostream *os,optional<int> *opt)

{
  bool bVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  optional<int> *in_RSI;
  ostream *in_RDI;
  optional<int> *in_stack_ffffffffffffffd0;
  ostream *local_8;
  
  bVar1 = optional<int>::has_value(in_RSI);
  if (bVar1) {
    poVar3 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar4 = std::type_info::name((type_info *)&int::typeinfo);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"> set: true ");
    poVar3 = std::operator<<(poVar3,"value: ");
    piVar2 = optional<int>::value(in_stack_ffffffffffffffd0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar2);
    local_8 = std::operator<<(poVar3," ]");
  }
  else {
    poVar3 = std::operator<<(in_RDI,"[ pstd::optional<");
    pcVar4 = std::type_info::name((type_info *)&int::typeinfo);
    poVar3 = std::operator<<(poVar3,pcVar4);
    local_8 = std::operator<<(poVar3,"> set: false value: n/a ]");
  }
  return local_8;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}